

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perplexity.cpp
# Opt level: O3

bool decode_helper(llama_context *ctx,llama_batch *batch,
                  vector<float,_std::allocator<float>_> *batch_logits,int n_batch,int n_vocab)

{
  int8_t *piVar1;
  pointer pfVar2;
  uint uVar3;
  void *__src;
  common_log *log;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined8 in_R9;
  long lVar8;
  int8_t *piVar9;
  undefined4 uStack_60;
  undefined4 local_58;
  undefined4 uStack_50;
  undefined4 local_48;
  undefined4 uStack_40;
  
  uVar4 = (ulong)(uint)batch->n_tokens;
  if (0 < batch->n_tokens) {
    lVar8 = 0;
    uVar5 = 0;
    do {
      uVar6 = (int)uVar4 - (int)lVar8;
      if (n_batch <= (int)uVar6) {
        uVar6 = n_batch;
      }
      piVar1 = batch->logits;
      uStack_60 = SUB84(batch->token + lVar8,0);
      local_58 = 0;
      uStack_50 = SUB84(batch->pos + lVar8,0);
      local_48 = SUB84(batch->n_seq_id + lVar8,0);
      uStack_40 = SUB84(batch->seq_id + lVar8,0);
      uVar7 = uVar6;
      piVar9 = piVar1 + lVar8;
      uVar3 = llama_decode();
      if (uVar3 != 0) {
        if (common_log_verbosity_thold < 0) {
          return false;
        }
        log = common_log_main();
        common_log_add(log,GGML_LOG_LEVEL_ERROR,
                       "failed to decode the batch, n_batch = %d, ret = %d\n",(ulong)(uint)n_batch,
                       (ulong)uVar3,in_R9,uVar7,uStack_60,local_58,uStack_50,local_48,uStack_40,
                       piVar9);
        return false;
      }
      if ((int)uVar6 < 1) {
        uVar7 = 0;
      }
      else {
        uVar4 = 0;
        uVar7 = 0;
        do {
          uVar7 = (uVar7 + 1) - (uint)((piVar1 + lVar8)[uVar4] == '\0');
          uVar4 = uVar4 + 1;
        } while (uVar4 < uVar6);
      }
      pfVar2 = (batch_logits->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      __src = (void *)llama_get_logits(ctx);
      memcpy(pfVar2 + (ulong)uVar5 * (long)n_vocab,__src,(ulong)uVar7 * (long)n_vocab * 4);
      uVar5 = uVar5 + uVar7;
      lVar8 = lVar8 + n_batch;
      uVar4 = (ulong)batch->n_tokens;
    } while (lVar8 < (long)uVar4);
  }
  return true;
}

Assistant:

static bool decode_helper(llama_context * ctx, llama_batch & batch, std::vector<float> & batch_logits, int n_batch, int n_vocab) {
    int prev_outputs = 0;
    for (int i = 0; i < (int) batch.n_tokens; i += n_batch) {
        const int n_tokens = std::min<int>(n_batch, batch.n_tokens - i);

        llama_batch batch_view = {
            n_tokens,
            batch.token    + i,
            nullptr,
            batch.pos      + i,
            batch.n_seq_id + i,
            batch.seq_id   + i,
            batch.logits   + i,
        };

        const int ret = llama_decode(ctx, batch_view);
        if (ret != 0) {
            LOG_ERR("failed to decode the batch, n_batch = %d, ret = %d\n", n_batch, ret);
            return false;
        }

        int n_outputs = 0;
        for (int i = 0; i < n_tokens; ++i) {
            n_outputs += batch_view.logits[i] != 0;
        }

        memcpy(batch_logits.data() + size_t(prev_outputs)*n_vocab, llama_get_logits(ctx), size_t(n_outputs)*n_vocab*sizeof(float));

        prev_outputs += n_outputs;
    }

    return true;
}